

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void output_in_edges(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  char *pcVar1;
  char *pcVar2;
  in_edge_t_conflict local_20;
  edge_t_conflict e;
  bb_t_conflict bb_local;
  gen_ctx_t gen_ctx_local;
  
  fprintf((FILE *)gen_ctx->debug_file,"  in edges:");
  for (local_20 = DLIST_in_edge_t_head(&bb->in_edges); local_20 != (in_edge_t_conflict)0x0;
      local_20 = DLIST_in_edge_t_next(local_20)) {
    pcVar1 = "";
    if (local_20->fall_through_p != '\0') {
      pcVar1 = "f";
    }
    pcVar2 = "";
    if (local_20->back_edge_p != '\0') {
      pcVar2 = "*";
    }
    fprintf((FILE *)gen_ctx->debug_file," %3lu%s%s",local_20->src->index,pcVar1,pcVar2);
  }
  fprintf((FILE *)gen_ctx->debug_file,"\n");
  return;
}

Assistant:

static void output_in_edges (gen_ctx_t gen_ctx, bb_t bb) {
  edge_t e;

  fprintf (debug_file, "  in edges:");
  for (e = DLIST_HEAD (in_edge_t, bb->in_edges); e != NULL; e = DLIST_NEXT (in_edge_t, e)) {
    fprintf (debug_file, " %3lu%s%s", (unsigned long) e->src->index, e->fall_through_p ? "f" : "",
             e->back_edge_p ? "*" : "");
  }
  fprintf (debug_file, "\n");
}